

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O3

int domonability(void)

{
  boolean bVar1;
  int iVar2;
  monst *pmVar3;
  char *line;
  
  bVar1 = attacktype(youmonst.data,0xc);
  if (bVar1 != '\0') {
    iVar2 = dobreathe();
    return iVar2;
  }
  bVar1 = attacktype(youmonst.data,10);
  if (bVar1 != '\0') {
    iVar2 = dospit();
    return iVar2;
  }
  if ((youmonst.data)->mlet == '\x0e') {
    iVar2 = doremove();
    return iVar2;
  }
  bVar1 = attacktype(youmonst.data,0xf);
  if (bVar1 != '\0') {
    iVar2 = dogaze();
    return iVar2;
  }
  if (((youmonst.data)->mflags2 & 4) != 0) {
    iVar2 = dosummon();
    return iVar2;
  }
  if (youmonst.data == mons + 100 || youmonst.data == mons + 0x62) {
    iVar2 = dospinweb();
    return iVar2;
  }
  if (((youmonst.data)->mflags1 & 0x100) != 0) {
    iVar2 = dohide();
    return iVar2;
  }
  if (youmonst.data != mons + 0x32 && youmonst.data != mons + 0x31) {
    if (u.umonnum == 0x29) {
      if (level->locations[u.ux][u.uy].typ == '\x1c') {
        pmVar3 = split_mon(&youmonst,(monst *)0x0);
        if (pmVar3 == (monst *)0x0) {
          return 0;
        }
        dryup(u.ux,u.uy,'\x01');
        return 0;
      }
      line = "There is no fountain here.";
    }
    else {
      if ((((youmonst.data)->mflags2 >> 0x1d & 1) != 0) && ((youmonst.data)->mlet == '\x15')) {
        fix_attributes_and_properties((obj *)0x0,0);
        return 1;
      }
      if ((youmonst.data)->msound == '\x0f') {
        pline("You shriek.");
        if ((u._1052_1_ & 0x20) == 0) {
          aggravate();
          return 0;
        }
        line = "Unfortunately sound does not carry well through rock.";
      }
      else if (u.umonnum == u.umonster) {
        line = "You don\'t have a special ability in your normal form!";
      }
      else {
        line = "Any special ability you may have is purely reflexive.";
      }
    }
    pline(line);
    return 0;
  }
  iVar2 = domindblast();
  return iVar2;
}

Assistant:

static int domonability(void)
{
	if (can_breathe(youmonst.data)) return dobreathe();
	else if (attacktype(youmonst.data, AT_SPIT)) return dospit();
	else if (youmonst.data->mlet == S_NYMPH) return doremove();
	else if (attacktype(youmonst.data, AT_GAZE)) return dogaze();
	else if (is_were(youmonst.data)) return dosummon();
	else if (webmaker(youmonst.data)) return dospinweb();
	else if (is_hider(youmonst.data)) return dohide();
	else if (is_mind_flayer(youmonst.data)) return domindblast();
	else if (u.umonnum == PM_GREMLIN) {
	    if (IS_FOUNTAIN(level->locations[u.ux][u.uy].typ)) {
		if (split_mon(&youmonst, NULL))
		    dryup(u.ux, u.uy, TRUE);
	    } else pline("There is no fountain here.");
	} else if (is_unicorn(youmonst.data)) {
	    fix_attributes_and_properties(NULL, 0);
	    return 1;
	} else if (youmonst.data->msound == MS_SHRIEK) {
	    pline("You shriek.");
	    if (u.uburied)
		pline("Unfortunately sound does not carry well through rock.");
	    else aggravate();
	} else if (Upolyd)
		pline("Any special ability you may have is purely reflexive.");
	else pline("You don't have a special ability in your normal form!");
	return 0;
}